

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::SparseTextureAllocationTestCase::verifyTexStorageInvalidValueErrors
          (SparseTextureAllocationTestCase *this,Functions *gl,GLint target,GLint format)

{
  GLint width_00;
  GLint internal_format;
  GLuint GVar1;
  Functions *gl_00;
  bool bVar2;
  GLint GVar3;
  GLenum GVar4;
  GLuint depth_00;
  ContextInfo *this_00;
  int local_50;
  int local_4c;
  GLint maxArrayTextureLayers;
  GLint maxTextureSize;
  GLint max3DTextureSize;
  GLint depth;
  GLint height;
  GLint width;
  GLint pageSizeZ;
  GLint pageSizeY;
  GLint pageSizeX;
  GLuint texture;
  GLint format_local;
  GLint target_local;
  Functions *gl_local;
  SparseTextureAllocationTestCase *this_local;
  
  pageSizeX = format;
  texture = target;
  _format_local = gl;
  gl_local = (Functions *)this;
  std::operator<<((ostream *)&this->field_0x88,"Verify Invalid Value errors - ");
  SparseTextureUtils::getTexturePageSizes(_format_local,texture,pageSizeX,&pageSizeZ,&width,&height)
  ;
  gl4cts::Texture::Generate(_format_local,(GLuint *)&pageSizeY);
  gl4cts::Texture::Bind(_format_local,pageSizeY,texture);
  depth = pageSizeZ;
  max3DTextureSize = width;
  GVar3 = SparseTextureUtils::getTargetDepth(texture);
  maxTextureSize = GVar3 * height;
  if (texture == 0x806f) {
    (*_format_local->getIntegerv)(0x9199,&maxArrayTextureLayers);
    GVar1 = texture;
    GVar4 = (*_format_local->getError)();
    bVar2 = SparseTextureUtils::verifyQueryError(&this->mLog,"getIntegerv",GVar1,0x9199,GVar4,0);
    if (!bVar2) {
      gl4cts::Texture::Delete(_format_local,(GLuint *)&pageSizeY);
      return false;
    }
    gl4cts::Texture::Storage
              (_format_local,texture,1,pageSizeX,depth + maxArrayTextureLayers,max3DTextureSize,
               maxTextureSize);
    GVar4 = (*_format_local->getError)();
    bVar2 = SparseTextureUtils::verifyError
                      (&this->mLog,"TexStorage [GL_TEXTURE_3D wrong width]",GVar4,0x501);
    if (!bVar2) {
      gl4cts::Texture::Delete(_format_local,(GLuint *)&pageSizeY);
      return false;
    }
    gl4cts::Texture::Storage
              (_format_local,texture,1,pageSizeX,depth,max3DTextureSize + maxArrayTextureLayers,
               maxTextureSize);
    GVar4 = (*_format_local->getError)();
    bVar2 = SparseTextureUtils::verifyError
                      (&this->mLog,"TexStorage [GL_TEXTURE_3D wrong height]",GVar4,0x501);
    if (!bVar2) {
      gl4cts::Texture::Delete(_format_local,(GLuint *)&pageSizeY);
      return false;
    }
    gl4cts::Texture::Storage
              (_format_local,texture,1,pageSizeX,depth,max3DTextureSize,
               maxTextureSize + maxArrayTextureLayers);
    GVar4 = (*_format_local->getError)();
    bVar2 = SparseTextureUtils::verifyError
                      (&this->mLog,"TexStorage [GL_TEXTURE_3D wrong depth]",GVar4,0x501);
    if (!bVar2) {
      gl4cts::Texture::Delete(_format_local,(GLuint *)&pageSizeY);
      return false;
    }
  }
  else {
    (*_format_local->getIntegerv)(0x9198,&local_4c);
    GVar1 = texture;
    GVar4 = (*_format_local->getError)();
    bVar2 = SparseTextureUtils::verifyQueryError(&this->mLog,"getIntegerv",GVar1,0x9198,GVar4,0);
    if (!bVar2) {
      gl4cts::Texture::Delete(_format_local,(GLuint *)&pageSizeY);
      return false;
    }
    gl4cts::Texture::Storage
              (_format_local,texture,1,pageSizeX,depth + local_4c,max3DTextureSize,maxTextureSize);
    GVar4 = (*_format_local->getError)();
    bVar2 = SparseTextureUtils::verifyError
                      (&this->mLog,"TexStorage [!GL_TEXTURE_3D wrong width]",GVar4,0x501);
    if (!bVar2) {
      gl4cts::Texture::Delete(_format_local,(GLuint *)&pageSizeY);
      return false;
    }
    gl4cts::Texture::Storage
              (_format_local,texture,1,pageSizeX,depth,max3DTextureSize + local_4c,maxTextureSize);
    GVar4 = (*_format_local->getError)();
    bVar2 = SparseTextureUtils::verifyError
                      (&this->mLog,"TexStorage [!GL_TEXTURE_3D wrong height]",GVar4,0x501);
    if (!bVar2) {
      gl4cts::Texture::Delete(_format_local,(GLuint *)&pageSizeY);
      return false;
    }
    (*_format_local->getIntegerv)(0x919a,&local_50);
    GVar1 = texture;
    GVar4 = (*_format_local->getError)();
    bVar2 = SparseTextureUtils::verifyQueryError(&this->mLog,"getIntegerv",GVar1,0x919a,GVar4,0);
    if (!bVar2) {
      gl4cts::Texture::Delete(_format_local,(GLuint *)&pageSizeY);
      return false;
    }
    if (texture == 0x8c18) {
      gl4cts::Texture::Storage(_format_local,0x8c18,1,pageSizeX,depth,max3DTextureSize + local_50,0)
      ;
      GVar4 = (*_format_local->getError)();
      bVar2 = SparseTextureUtils::verifyError
                        (&this->mLog,"TexStorage [ARRAY wrong height]",GVar4,0x501);
      if (!bVar2) {
        gl4cts::Texture::Delete(_format_local,(GLuint *)&pageSizeY);
        return false;
      }
    }
    else if ((texture == 0x8c1a) || (texture == 0x9009)) {
      gl4cts::Texture::Storage
                (_format_local,texture,1,pageSizeX,depth,max3DTextureSize,maxTextureSize + local_50)
      ;
      GVar4 = (*_format_local->getError)();
      bVar2 = SparseTextureUtils::verifyError
                        (&this->mLog,"TexStorage [ARRAY wrong depth]",GVar4,0x501);
      if (!bVar2) {
        gl4cts::Texture::Delete(_format_local,(GLuint *)&pageSizeY);
        return false;
      }
    }
  }
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar2 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_sparse_texture2");
  if (!bVar2) {
    if (1 < pageSizeZ) {
      gl4cts::Texture::Storage(_format_local,texture,1,pageSizeX,1,max3DTextureSize,maxTextureSize);
      GVar4 = (*_format_local->getError)();
      bVar2 = SparseTextureUtils::verifyError(&this->mLog,"TexStorage [wrong width]",GVar4,0x501);
      if (!bVar2) {
        gl4cts::Texture::Delete(_format_local,(GLuint *)&pageSizeY);
        return false;
      }
    }
    if (1 < width) {
      gl4cts::Texture::Storage(_format_local,texture,1,pageSizeX,depth,1,maxTextureSize);
      GVar4 = (*_format_local->getError)();
      bVar2 = SparseTextureUtils::verifyError(&this->mLog,"TexStorage [wrong height]",GVar4,0x501);
      if (!bVar2) {
        gl4cts::Texture::Delete(_format_local,(GLuint *)&pageSizeY);
        return false;
      }
    }
    gl_00 = _format_local;
    GVar1 = texture;
    internal_format = pageSizeX;
    width_00 = depth;
    GVar3 = max3DTextureSize;
    if (1 < height) {
      depth_00 = SparseTextureUtils::getTargetDepth(texture);
      gl4cts::Texture::Storage(gl_00,GVar1,1,internal_format,width_00,GVar3,depth_00);
      GVar4 = (*_format_local->getError)();
      bVar2 = SparseTextureUtils::verifyError(&this->mLog,"TexStorage [wrong depth]",GVar4,0x501);
      if (!bVar2) {
        gl4cts::Texture::Delete(_format_local,(GLuint *)&pageSizeY);
        return false;
      }
    }
  }
  gl4cts::Texture::Delete(_format_local,(GLuint *)&pageSizeY);
  return true;
}

Assistant:

bool SparseTextureAllocationTestCase::verifyTexStorageInvalidValueErrors(const Functions& gl, GLint target,
																		 GLint format)
{
	mLog << "Verify Invalid Value errors - ";

	GLuint texture;
	GLint  pageSizeX;
	GLint  pageSizeY;
	GLint  pageSizeZ;
	SparseTextureUtils::getTexturePageSizes(gl, target, format, pageSizeX, pageSizeY, pageSizeZ);

	Texture::Generate(gl, texture);
	Texture::Bind(gl, texture, target);

	GLint width  = pageSizeX;
	GLint height = pageSizeY;
	GLint depth  = SparseTextureUtils::getTargetDepth(target) * pageSizeZ;

	if (target == GL_TEXTURE_3D)
	{
		GLint max3DTextureSize;

		gl.getIntegerv(GL_MAX_SPARSE_3D_TEXTURE_SIZE_ARB, &max3DTextureSize);
		if (!SparseTextureUtils::verifyQueryError(mLog, "getIntegerv", target, GL_MAX_SPARSE_3D_TEXTURE_SIZE_ARB,
												  gl.getError(), GL_NO_ERROR))
		{
			Texture::Delete(gl, texture);
			return false;
		}

		// Check 3 different cases:
		// 1) wrong width
		// 2) wrong height
		// 3) wrong depth
		Texture::Storage(gl, target, 1, format, width + max3DTextureSize, height, depth);
		if (!SparseTextureUtils::verifyError(mLog, "TexStorage [GL_TEXTURE_3D wrong width]", gl.getError(),
											 GL_INVALID_VALUE))
		{
			Texture::Delete(gl, texture);
			return false;
		}

		Texture::Storage(gl, target, 1, format, width, height + max3DTextureSize, depth);
		if (!SparseTextureUtils::verifyError(mLog, "TexStorage [GL_TEXTURE_3D wrong height]", gl.getError(),
											 GL_INVALID_VALUE))
		{
			Texture::Delete(gl, texture);
			return false;
		}

		Texture::Storage(gl, target, 1, format, width, height, depth + max3DTextureSize);
		if (!SparseTextureUtils::verifyError(mLog, "TexStorage [GL_TEXTURE_3D wrong depth]", gl.getError(),
											 GL_INVALID_VALUE))
		{
			Texture::Delete(gl, texture);
			return false;
		}
	}
	else
	{
		GLint maxTextureSize;

		gl.getIntegerv(GL_MAX_SPARSE_TEXTURE_SIZE_ARB, &maxTextureSize);
		if (!SparseTextureUtils::verifyQueryError(mLog, "getIntegerv", target, GL_MAX_SPARSE_TEXTURE_SIZE_ARB,
												  gl.getError(), GL_NO_ERROR))
		{
			Texture::Delete(gl, texture);
			return false;
		}

		// Check 3 different cases:
		// 1) wrong width
		// 2) wrong height
		Texture::Storage(gl, target, 1, format, width + maxTextureSize, height, depth);
		if (!SparseTextureUtils::verifyError(mLog, "TexStorage [!GL_TEXTURE_3D wrong width]", gl.getError(),
											 GL_INVALID_VALUE))
		{
			Texture::Delete(gl, texture);
			return false;
		}

		Texture::Storage(gl, target, 1, format, width, height + maxTextureSize, depth);
		if (!SparseTextureUtils::verifyError(mLog, "TexStorage [!GL_TEXTURE_3D wrong height]", gl.getError(),
											 GL_INVALID_VALUE))
		{
			Texture::Delete(gl, texture);
			return false;
		}

		GLint maxArrayTextureLayers;

		gl.getIntegerv(GL_MAX_SPARSE_ARRAY_TEXTURE_LAYERS_ARB, &maxArrayTextureLayers);
		if (!SparseTextureUtils::verifyQueryError(mLog, "getIntegerv", target, GL_MAX_SPARSE_ARRAY_TEXTURE_LAYERS_ARB,
												  gl.getError(), GL_NO_ERROR))
		{
			Texture::Delete(gl, texture);
			return false;
		}

		if (target == GL_TEXTURE_1D_ARRAY)
		{
			Texture::Storage(gl, target, 1, format, width, height + maxArrayTextureLayers, 0);
			if (!SparseTextureUtils::verifyError(mLog, "TexStorage [ARRAY wrong height]", gl.getError(),
												 GL_INVALID_VALUE))
			{
				Texture::Delete(gl, texture);
				return false;
			}
		}
		else if ((target == GL_TEXTURE_2D_ARRAY || target == GL_TEXTURE_CUBE_MAP_ARRAY))
		{
			Texture::Storage(gl, target, 1, format, width, height, depth + maxArrayTextureLayers);
			if (!SparseTextureUtils::verifyError(mLog, "TexStorage [ARRAY wrong depth]", gl.getError(),
												 GL_INVALID_VALUE))
			{
				Texture::Delete(gl, texture);
				return false;
			}
		}
	}

	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_texture2"))
	{
		if (pageSizeX > 1)
		{
			Texture::Storage(gl, target, 1, format, 1, height, depth);
			if (!SparseTextureUtils::verifyError(mLog, "TexStorage [wrong width]", gl.getError(), GL_INVALID_VALUE))
			{
				Texture::Delete(gl, texture);
				return false;
			}
		}

		if (pageSizeY > 1)
		{
			Texture::Storage(gl, target, 1, format, width, 1, depth);
			if (!SparseTextureUtils::verifyError(mLog, "TexStorage [wrong height]", gl.getError(), GL_INVALID_VALUE))
			{
				Texture::Delete(gl, texture);
				return false;
			}
		}

		if (pageSizeZ > 1)
		{
			Texture::Storage(gl, target, 1, format, width, height, SparseTextureUtils::getTargetDepth(target));
			if (!SparseTextureUtils::verifyError(mLog, "TexStorage [wrong depth]", gl.getError(), GL_INVALID_VALUE))
			{
				Texture::Delete(gl, texture);
				return false;
			}
		}
	}

	Texture::Delete(gl, texture);
	return true;
}